

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_lpf2_reinit(ma_lpf2_config *pConfig,ma_lpf2 *pLPF)

{
  long in_RSI;
  undefined4 *in_RDI;
  ma_biquad_config bqConfig_1;
  ma_biquad_config bqConfig;
  ma_result result;
  double a;
  double c;
  double s;
  double w;
  double q;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 local_a0 [84];
  ma_result local_4c;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  undefined4 *local_20;
  double local_18;
  double local_10;
  double local_8;
  
  if ((in_RSI == 0) || (in_RDI == (undefined4 *)0x0)) {
    local_4c = MA_INVALID_ARGS;
  }
  else {
    local_28 = *(double *)(in_RDI + 6);
    local_30 = (*(double *)(in_RDI + 4) * 6.283185307179586) / (double)(uint)in_RDI[2];
    local_20 = in_RDI;
    local_18 = local_30;
    local_38 = sin(local_30);
    local_10 = local_30;
    local_8 = 1.5707963267948966 - local_30;
    local_40 = sin(local_8);
    local_48 = local_38 / (local_28 * 2.0);
    uVar1 = *local_20;
    uVar2 = local_20[1];
    memcpy(local_a0,&stack0xffffffffffffff28,0x38);
    local_4c = ma_biquad_reinit((ma_biquad_config *)CONCAT44(uVar2,uVar1),(ma_biquad *)0x213d6d);
    if (local_4c == MA_SUCCESS) {
      local_4c = MA_SUCCESS;
    }
  }
  return local_4c;
}

Assistant:

MA_API ma_result ma_lpf2_reinit(const ma_lpf2_config* pConfig, ma_lpf2* pLPF)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pLPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_lpf2__get_biquad_config(pConfig);
    result = ma_biquad_reinit(&bqConfig, &pLPF->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}